

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,GLenum e)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  iVar2 = (int)this;
  if (iVar2 < 0x8814) {
    if (iVar2 < 0x8229) {
      if (iVar2 == 0x8058) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rgba8";
        pcVar1 = "";
      }
      else if (iVar2 == 0x8059) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rgb10_a2";
        pcVar1 = "";
      }
      else {
        if (iVar2 != 0x805b) goto switchD_009a3aa1_default;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rgba16";
        pcVar1 = "";
      }
    }
    else {
      switch(iVar2) {
      case 0x8229:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "r8";
        pcVar1 = "";
        break;
      case 0x822a:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "r16";
        pcVar1 = "";
        break;
      case 0x822b:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rg8";
        pcVar1 = "";
        break;
      case 0x822c:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rg16";
        pcVar1 = "";
        break;
      case 0x822d:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "r16f";
        pcVar1 = "";
        break;
      case 0x822e:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "r32f";
        pcVar1 = "";
        break;
      case 0x822f:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rg16f";
        pcVar1 = "";
        break;
      case 0x8230:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rg32f";
        pcVar1 = "";
        break;
      case 0x8231:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "r8i";
        pcVar1 = "";
        break;
      case 0x8232:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "r8ui";
        pcVar1 = "";
        break;
      case 0x8233:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "r16i";
        pcVar1 = "";
        break;
      case 0x8234:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "r16ui";
        pcVar1 = "";
        break;
      case 0x8235:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "r32i";
        pcVar1 = "";
        break;
      case 0x8236:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "r32ui";
        pcVar1 = "";
        break;
      case 0x8237:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rg8i";
        pcVar1 = "";
        break;
      case 0x8238:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rg8ui";
        pcVar1 = "";
        break;
      case 0x8239:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rg16i";
        pcVar1 = "";
        break;
      case 0x823a:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rg16ui";
        pcVar1 = "";
        break;
      case 0x823b:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rg32i";
        pcVar1 = "";
        break;
      case 0x823c:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rg32ui";
        pcVar1 = "";
        break;
      default:
        goto switchD_009a3aa1_default;
      }
    }
  }
  else if (iVar2 < 0x8d8e) {
    if (iVar2 < 0x8d76) {
      if (iVar2 < 0x8c3a) {
        if (iVar2 == 0x8814) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = "rgba32f";
          pcVar1 = "";
        }
        else {
          if (iVar2 != 0x881a) goto switchD_009a3aa1_default;
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = "rgba16f";
          pcVar1 = "";
        }
      }
      else if (iVar2 == 0x8c3a) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "r11f_g11f_b10f";
        pcVar1 = "";
      }
      else {
        if (iVar2 != 0x8d70) goto switchD_009a3aa1_default;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rgba32ui";
        pcVar1 = "";
      }
    }
    else if (iVar2 < 0x8d82) {
      if (iVar2 == 0x8d76) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rgba16ui";
        pcVar1 = "";
      }
      else {
        if (iVar2 != 0x8d7c) goto switchD_009a3aa1_default;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rgba8ui";
        pcVar1 = "";
      }
    }
    else if (iVar2 == 0x8d82) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "rgba32i";
      pcVar1 = "";
    }
    else {
      if (iVar2 != 0x8d88) goto switchD_009a3aa1_default;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "rgba16i";
      pcVar1 = "";
    }
  }
  else {
    switch(iVar2) {
    case 0x8f94:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "r8_snorm";
      pcVar1 = "";
      break;
    case 0x8f95:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "rg8_snorm";
      pcVar1 = "";
      break;
    case 0x8f96:
    case 0x8f9a:
switchD_009a3aa1_default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                    ,0x244,
                    "std::string gl4cts::(anonymous namespace)::ShaderImageLoadStoreBase::FormatEnumToString(GLenum)"
                   );
    case 0x8f97:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "rgba8_snorm";
      pcVar1 = "";
      break;
    case 0x8f98:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "r16_snorm";
      pcVar1 = "";
      break;
    case 0x8f99:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "rg16_snorm";
      pcVar1 = "";
      break;
    case 0x8f9b:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "rgba16_snorm";
      pcVar1 = "";
      break;
    default:
      if (iVar2 == 0x8d8e) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rgba8i";
        pcVar1 = "";
      }
      else {
        if (iVar2 != 0x906f) goto switchD_009a3aa1_default;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "rgb10_a2ui";
        pcVar1 = "";
      }
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEnumToString(GLenum e)
	{
		switch (e)
		{
		case GL_RGBA32F:
			return "rgba32f";
		case GL_RGBA16F:
			return "rgba16f";
		case GL_RG32F:
			return "rg32f";
		case GL_RG16F:
			return "rg16f";
		case GL_R11F_G11F_B10F:
			return "r11f_g11f_b10f";
		case GL_R32F:
			return "r32f";
		case GL_R16F:
			return "r16f";

		case GL_RGBA32UI:
			return "rgba32ui";
		case GL_RGBA16UI:
			return "rgba16ui";
		case GL_RGB10_A2UI:
			return "rgb10_a2ui";
		case GL_RGBA8UI:
			return "rgba8ui";
		case GL_RG32UI:
			return "rg32ui";
		case GL_RG16UI:
			return "rg16ui";
		case GL_RG8UI:
			return "rg8ui";
		case GL_R32UI:
			return "r32ui";
		case GL_R16UI:
			return "r16ui";
		case GL_R8UI:
			return "r8ui";

		case GL_RGBA32I:
			return "rgba32i";
		case GL_RGBA16I:
			return "rgba16i";
		case GL_RGBA8I:
			return "rgba8i";
		case GL_RG32I:
			return "rg32i";
		case GL_RG16I:
			return "rg16i";
		case GL_RG8I:
			return "rg8i";
		case GL_R32I:
			return "r32i";
		case GL_R16I:
			return "r16i";
		case GL_R8I:
			return "r8i";

		case GL_RGBA16:
			return "rgba16";
		case GL_RGB10_A2:
			return "rgb10_a2";
		case GL_RGBA8:
			return "rgba8";
		case GL_RG16:
			return "rg16";
		case GL_RG8:
			return "rg8";
		case GL_R16:
			return "r16";
		case GL_R8:
			return "r8";

		case GL_RGBA16_SNORM:
			return "rgba16_snorm";
		case GL_RGBA8_SNORM:
			return "rgba8_snorm";
		case GL_RG16_SNORM:
			return "rg16_snorm";
		case GL_RG8_SNORM:
			return "rg8_snorm";
		case GL_R16_SNORM:
			return "r16_snorm";
		case GL_R8_SNORM:
			return "r8_snorm";
		}

		assert(0);
		return "";
	}